

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

shared_ptr<ot::commissioner::coap::Message> __thiscall
ot::commissioner::coap::Message::Deserialize(Message *this,Error *aError,ByteArray *aBuf)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  Error *pEVar4;
  size_type sVar5;
  const_reference pvVar6;
  size_type sVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  shared_ptr<ot::commissioner::coap::Message> sVar9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  shared_ptr<ot::commissioner::coap::Message> local_488;
  ErrorCode local_474;
  uchar *local_470;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_468;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_460;
  anon_class_1_0_00000001 local_452;
  v10 local_451;
  v10 *local_450;
  size_t local_448;
  string local_440;
  Error local_420;
  int local_3f4;
  Error local_3f0;
  ErrorCode local_3c8;
  anon_class_1_0_00000001 local_3c2;
  v10 local_3c1;
  v10 *local_3c0;
  char *local_3b8;
  string local_3b0;
  Error local_390;
  Error local_368;
  ErrorCode local_33c;
  Error local_338;
  undefined1 local_310 [8];
  OptionValue value;
  OptionType number;
  v10 *pvStack_2f0;
  size_t local_2e8;
  string local_2e0;
  Error local_2c0;
  ErrorCode local_294;
  Error local_290;
  byte local_253;
  type local_252;
  ulong uStack_250;
  uint16_t lastOptionNumber;
  size_t offset;
  Error error;
  ByteArray *aBuf_local;
  Error *aError_local;
  shared_ptr<ot::commissioner::coap::Message> *message;
  undefined1 local_1f8 [16];
  v10 *local_1e8;
  char *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ot::commissioner::coap::OptionType>
  *local_1d8;
  v10 *local_1d0;
  char *pcStack_1c8;
  string *local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1b8 [3];
  undefined1 local_1a0 [16];
  v10 *local_190;
  ulong local_188;
  v10 *local_180;
  size_t sStack_178;
  string *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_168 [2];
  undefined1 local_158 [16];
  v10 *local_148;
  ulong local_140;
  v10 *local_138;
  size_t sStack_130;
  string *local_128;
  v10 *local_120;
  undefined1 *local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  char *pcStack_e0;
  shared_ptr<ot::commissioner::coap::Message> **local_d0;
  undefined1 *local_c8;
  shared_ptr<ot::commissioner::coap::Message> **local_c0;
  shared_ptr<ot::commissioner::coap::Message> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  error.mMessage.field_2._8_8_ = aBuf;
  Error::Error((Error *)&offset);
  uStack_250 = 0;
  local_253 = 0;
  std::make_shared<ot::commissioner::coap::Message>();
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  Deserialize(&local_290,&peVar3->mHeader,(ByteArray *)error.mMessage.field_2._8_8_,
              &stack0xfffffffffffffdb0);
  pEVar4 = Error::operator=((Error *)&offset,&local_290);
  local_294 = kNone;
  bVar2 = commissioner::operator!=(pEVar4,&local_294);
  Error::~Error(&local_290);
  if (!bVar2) {
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar2 = Header::IsValid(&peVar3->mHeader);
    if (bVar2) {
      local_252 = 0;
      do {
        uVar1 = uStack_250;
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           error.mMessage.field_2._8_8_);
        bVar2 = false;
        if (uVar1 < sVar5) {
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              error.mMessage.field_2._8_8_,uStack_250);
          bVar2 = *pvVar6 != 0xff;
        }
        uVar1 = uStack_250;
        if (!bVar2) {
          sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             error.mMessage.field_2._8_8_);
          sVar5 = uStack_250;
          if (uVar1 < sVar7) {
            uStack_250 = uStack_250 + 1;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                error.mMessage.field_2._8_8_,sVar5);
            uVar1 = uStack_250;
            if (*pvVar6 == 0xff) {
              sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 error.mMessage.field_2._8_8_);
              if (uVar1 < sVar5) {
                peVar3 = std::
                         __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this);
                local_468._M_current =
                     (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         error.mMessage.field_2._8_8_);
                local_460 = __gnu_cxx::
                            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::operator+(&local_468,uStack_250);
                local_470 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                               ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)error.mMessage.field_2._8_8_);
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&peVar3->mPayload,
                           local_460,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_470);
              }
              else {
                Deserialize::anon_class_1_0_00000001::operator()(&local_452);
                local_f8 = &local_450;
                local_100 = &local_451;
                bVar8 = ::fmt::v10::operator()(local_100);
                local_448 = bVar8.size_;
                local_450 = (v10 *)bVar8.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_170 = &local_440;
                local_180 = local_450;
                sStack_178 = local_448;
                local_80 = &local_180;
                local_190 = local_450;
                local_188 = local_448;
                local_78 = local_190;
                sStack_70 = local_188;
                local_1b8[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_38 = local_1a0;
                local_40 = local_1b8;
                local_28 = 0;
                args_01.field_1.values_ = in_R9.values_;
                args_01.desc_ = (unsigned_long_long)local_40;
                fmt_01.size_ = 0;
                fmt_01.data_ = (char *)local_188;
                local_30 = local_40;
                local_20 = local_38;
                local_18 = local_40;
                ::fmt::v10::vformat_abi_cxx11_(&local_440,local_190,fmt_01,args_01);
                Error::Error(&local_420,kBadFormat,&local_440);
                Error::operator=((Error *)&offset,&local_420);
                Error::~Error(&local_420);
                std::__cxx11::string::~string((string *)&local_440);
              }
            }
            else {
              peVar3 = std::
                       __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)this);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&peVar3->mPayload);
            }
          }
          goto LAB_002eec52;
        }
        OptionValue::OptionValue((OptionValue *)local_310);
        in_R9.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
             &stack0xfffffffffffffdb0;
        Deserialize(&local_338,
                    (OptionType *)
                    ((long)&value.mValue.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                    (OptionValue *)local_310,local_252,(ByteArray *)error.mMessage.field_2._8_8_,
                    (size_t *)in_R9.values_);
        pEVar4 = Error::operator=((Error *)&offset,&local_338);
        local_33c = kNone;
        bVar2 = commissioner::operator!=(pEVar4,&local_33c);
        Error::~Error(&local_338);
        if (bVar2) {
          local_3f4 = 4;
        }
        else {
          this_00 = (v10 *)local_310;
          bVar2 = IsValidOption(value.mValue.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_,
                                (OptionValue *)this_00);
          if (bVar2) {
            peVar3 = std::
                     __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            AppendOption(&local_368,peVar3,
                         value.mValue.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._2_2_,(OptionValue *)local_310);
            Error::operator=((Error *)&offset,&local_368);
            Error::~Error(&local_368);
          }
          else {
            Deserialize::anon_class_1_0_00000001::operator()(&local_3c2);
            local_108 = &local_3c0;
            local_110 = &local_3c1;
            bVar8 = ::fmt::v10::operator()(local_110);
            local_3b8 = (char *)bVar8.size_;
            local_3c0 = (v10 *)bVar8.data_;
            ::fmt::v10::detail::
            check_format_string<ot::commissioner::coap::OptionType_&,_FMT_COMPILE_STRING,_0>();
            local_1c0 = &local_3b0;
            local_1d0 = local_3c0;
            pcStack_1c8 = local_3b8;
            local_1d8 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ot::commissioner::coap::OptionType>
                         *)((long)&value.mValue.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
            local_f0 = &local_1d0;
            local_1e8 = local_3c0;
            local_1e0 = local_3b8;
            local_e8 = local_1e8;
            pcStack_e0 = local_1e0;
            message = (shared_ptr<ot::commissioner::coap::Message> *)
                      ::fmt::v10::
                      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ot::commissioner::coap::OptionType>
                                (local_1d8,this_00,(OptionType *)local_1c0);
            local_c8 = local_1f8;
            local_d0 = &message;
            local_b0 = 0xf;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)local_d0;
            fmt_00.size_ = 0xf;
            fmt_00.data_ = local_1e0;
            local_c0 = local_d0;
            local_b8 = local_d0;
            local_a8 = local_c8;
            ::fmt::v10::vformat_abi_cxx11_(&local_3b0,local_1e8,fmt_00,args_00);
            Error::Error(&local_390,kBadFormat,&local_3b0);
            Error::operator=((Error *)&offset,&local_390);
            Error::~Error(&local_390);
            std::__cxx11::string::~string((string *)&local_3b0);
          }
          local_3c8 = kNone;
          bVar2 = commissioner::operator!=((Error *)&offset,&local_3c8);
          if (bVar2) {
            bVar2 = IsCriticalOption(value.mValue.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_);
            if (bVar2) {
              local_3f4 = 4;
              goto LAB_002ee923;
            }
            Error::Error(&local_3f0);
            Error::operator=((Error *)&offset,&local_3f0);
            Error::~Error(&local_3f0);
          }
          local_252 = utils::to_underlying<ot::commissioner::coap::OptionType>
                                (value.mValue.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_);
          local_3f4 = 0;
        }
LAB_002ee923:
        OptionValue::~OptionValue((OptionValue *)local_310);
      } while (local_3f4 == 0);
      if (local_3f4 != 4) goto LAB_002eecd8;
    }
    else {
      Deserialize::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 ((long)&value.mValue.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6));
      local_118 = (undefined1 *)&stack0xfffffffffffffd10;
      local_120 = (v10 *)((long)&value.mValue.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      bVar8 = ::fmt::v10::operator()(local_120);
      local_2e8 = bVar8.size_;
      pvStack_2f0 = (v10 *)bVar8.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_128 = &local_2e0;
      local_138 = pvStack_2f0;
      sStack_130 = local_2e8;
      local_a0 = &local_138;
      local_148 = pvStack_2f0;
      local_140 = local_2e8;
      local_98 = local_148;
      sStack_90 = local_140;
      local_168[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_60 = local_158;
      local_68 = local_168;
      local_50 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_68;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_140;
      local_58 = local_68;
      local_48 = local_60;
      local_10 = local_68;
      ::fmt::v10::vformat_abi_cxx11_(&local_2e0,local_148,fmt,args);
      Error::Error(&local_2c0,kBadFormat,&local_2e0);
      Error::operator=((Error *)&offset,&local_2c0);
      Error::~Error(&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
  }
LAB_002eec52:
  local_474 = kNone;
  bVar2 = commissioner::operator!=((Error *)&offset,&local_474);
  if (bVar2) {
    std::shared_ptr<ot::commissioner::coap::Message>::shared_ptr(&local_488,(nullptr_t)0x0);
    std::shared_ptr<ot::commissioner::coap::Message>::operator=
              ((shared_ptr<ot::commissioner::coap::Message> *)this,&local_488);
    std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr(&local_488);
  }
  Error::operator=(aError,(Error *)&offset);
  local_253 = 1;
  local_3f4 = 1;
LAB_002eecd8:
  if ((local_253 & 1) == 0) {
    std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
              ((shared_ptr<ot::commissioner::coap::Message> *)this);
  }
  Error::~Error((Error *)&offset);
  sVar9.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar9.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<ot::commissioner::coap::Message>)
         sVar9.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Message> Message::Deserialize(Error &aError, const ByteArray &aBuf)
{
    Error    error;
    size_t   offset = 0;
    uint16_t lastOptionNumber;
    auto     message = std::make_shared<Message>();

    SuccessOrExit(error = Deserialize(message->mHeader, aBuf, offset));
    VerifyOrExit(message->mHeader.IsValid(), error = ERROR_BAD_FORMAT("invalid CoAP message header"));

    lastOptionNumber = 0;
    while (offset < aBuf.size() && aBuf[offset] != kPayloadMarker)
    {
        OptionType  number;
        OptionValue value;

        SuccessOrExit(error = Deserialize(number, value, lastOptionNumber, aBuf, offset));

        if (IsValidOption(number, value))
        {
            // AppendOption will do further validation before adding the option.
            error = message->AppendOption(number, value);
        }
        else
        {
            error = ERROR_BAD_FORMAT("bad CoAP option (number={}", number);
        }

        if (error != ErrorCode::kNone)
        {
            if (IsCriticalOption(number))
            {
                // Stop if any unrecognized option is critical.
                ExitNow();
            }
            else
            {
                // Ignore non-critical option error.
                error = ERROR_NONE;
            }
        }

        lastOptionNumber = utils::to_underlying(number);
    }

    if (offset < aBuf.size())
    {
        if (aBuf[offset++] == kPayloadMarker)
        {
            VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("payload marker followed by empty payload"));
            message->mPayload.assign(aBuf.begin() + offset, aBuf.end());
        }
        else
        {
            // Ignore extra data.
            message->mPayload.clear();
        }
    }

exit:
    if (error != ErrorCode::kNone)
    {
        message = nullptr;
    }
    aError = error;
    return message;
}